

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void clenshaw_curtis_compute(int n,double *x,double *w)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"CLENSHAW_CURTIS_COMPUTE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  N < 1.\n");
    exit(1);
  }
  if (n == 1) {
    *x = 0.0;
    *w = 2.0;
    return;
  }
  uVar8 = (ulong)(uint)n;
  pvVar1 = operator_new__(uVar8 * 8);
  uVar5 = n - 1;
  dVar13 = (double)(int)uVar5;
  uVar2 = 0;
  do {
    *(double *)((long)pvVar1 + uVar2 * 8) = ((double)(int)uVar2 * 3.141592653589793) / dVar13;
    uVar2 = uVar2 + 1;
  } while (uVar8 != uVar2);
  uVar2 = 1;
  if (1 < n) {
    uVar2 = (ulong)(uint)n;
  }
  uVar9 = 0;
  do {
    dVar11 = cos(*(double *)((long)pvVar1 + uVar9 * 8));
    x[uVar9] = dVar11;
    uVar9 = uVar9 + 1;
  } while (uVar2 != uVar9);
  uVar2 = 1;
  if (1 < n) {
    uVar2 = (ulong)(uint)n;
  }
  uVar9 = 0;
  do {
    w[uVar9] = 1.0;
    if (2 < (uint)n) {
      iVar7 = 4;
      uVar4 = 2;
      uVar6 = 1;
      do {
        dVar11 = w[uVar9];
        dVar12 = cos((double)uVar4 * *(double *)((long)pvVar1 + uVar9 * 8));
        w[uVar9] = dVar11 - (dVar12 * *(double *)(&DAT_0022cd40 + (ulong)(uVar4 - n == -1) * 8)) /
                            (double)(int)(iVar7 * uVar6 + -1);
        iVar7 = iVar7 + 4;
        uVar4 = uVar4 + 2;
        bVar10 = uVar6 != uVar5 >> 1;
        uVar6 = uVar6 + 1;
      } while (bVar10);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != uVar2);
  *w = *w / dVar13;
  if (2 < n) {
    lVar3 = 0;
    do {
      w[lVar3 + 1] = (w[lVar3 + 1] + w[lVar3 + 1]) / dVar13;
      lVar3 = lVar3 + 1;
    } while (uVar8 - 2 != lVar3);
  }
  w[uVar5] = w[uVar5] / dVar13;
  operator_delete__(pvVar1);
  return;
}

Assistant:

void clenshaw_curtis_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    CLENSHAW_CURTIS_COMPUTE computes a Clenshaw Curtis quadrature rule.
//
//  Discussion:
//
//    This method uses a direct approach.  The paper by Waldvogel
//    exhibits a more efficient approach using Fourier transforms.
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) W(I) * F ( X(I) )
//
//    The abscissas for the rule of order ORDER can be regarded 
//    as the cosines of equally spaced angles between 180 and 0 degrees:
//
//      X(I) = cos ( ( I - 1 ) * PI / ( ORDER - 1 ) )
//
//    except for the basic case ORDER = 1, when
//
//      X(1) = 0.
//
//    A Clenshaw-Curtis rule that uses ORDER points will integrate
//    exactly all polynomials of degrees 0 through ORDER-1.  If ORDER
//    is odd, then by symmetry the polynomial of degree ORDER will
//    also be integrated exactly.
//
//    If the value of ORDER is increased in a sensible way, then
//    the new set of abscissas will include the old ones.  One such
//    sequence would be ORDER(K) = 2*K+1 for K = 0, 1, 2, ...
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Charles Clenshaw, Alan Curtis,
//    A Method for Numerical Integration on an Automatic Computer,
//    Numerische Mathematik,
//    Volume 2, Number 1, December 1960, pages 197-205.
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double b;
  int i;
  int j;
  const double r8_pi = 3.141592653589793;
  double *theta;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "CLENSHAW_CURTIS_COMPUTE - Fatal error!\n";
    std::cerr << "  N < 1.\n";
    exit ( 1 );
  }

  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = 2.0;
    return;
  }

  theta = new double[n];

  for ( i = 1; i <= n; i++ )
  {
    theta[i-1] = double( i - 1 ) * r8_pi 
               / double( n - 1 );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( theta[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 1.0;

    for ( j = 1; j <= ( ( n - 1 ) / 2 ); j++ )
    {
      if ( 2 * j == ( n - 1 ) )
      {
        b = 1.0;
      }
      else
      {
        b = 2.0;
      }

      w[i] = w[i] - b * cos ( 2.0 * double( j ) * theta[i] ) 
           / double( 4 * j * j - 1 );
    }
  }

  w[0] = w[0] / double( n - 1 );
  for ( i = 2; i <= n-1; i++ )
  {
    w[i-1] = 2.0 * w[i-1] / double( n - 1 );
  }
  w[n-1] = w[n-1] / double( n - 1 );

  delete [] theta;

  return;
}